

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR
                   (XrSession session,XrViewConfigurationType viewConfigurationType,
                   uint32_t viewIndex,XrVisibilityMaskTypeKHR visibilityMaskType,
                   XrVisibilityMaskKHR *visibilityMask)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *pGVar3;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  allocator local_921;
  string local_920 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_900;
  allocator local_8e1;
  string local_8e0 [39];
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_848;
  allocator local_829;
  string local_828 [39];
  allocator local_801;
  string local_800 [32];
  string local_7e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_7c0;
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [32];
  string local_758 [32];
  ostringstream local_738 [8];
  ostringstream oss_enum_1;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [32];
  string local_548 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_528;
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [32];
  ostringstream local_4a0 [8];
  ostringstream oss_enum;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  GenValidUsageXrInstanceInfo *local_2b0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrSession_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrVisibilityMaskKHR *visibilityMask_local;
  XrVisibilityMaskTypeKHR visibilityMaskType_local;
  uint32_t viewIndex_local;
  XrViewConfigurationType viewConfigurationType_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  _viewIndex_local = session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,(XrSession_T **)&viewIndex_local,&local_54);
  VVar2 = VerifyXrSessionHandle((XrSession *)&viewIndex_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,_viewIndex_local);
    pGVar3 = pVar4.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    local_2b0 = pGVar3;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"xrGetVisibilityMaskKHR",&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"xrGetVisibilityMaskKHR",&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"viewConfigurationType",&local_321);
    bVar1 = ValidateXrEnum(pGVar3,(string *)local_2d0,(string *)local_2f8,(string *)local_320,
                           (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)local_50,viewConfigurationType);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    pGVar3 = local_2b0;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_568,"xrGetVisibilityMaskKHR",&local_569);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_590,"xrGetVisibilityMaskKHR",&local_591);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,"visibilityMaskType",&local_5b9);
      bVar1 = ValidateXrEnum(pGVar3,(string *)local_568,(string *)local_590,(string *)local_5b8,
                             (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)local_50,visibilityMaskType);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      std::__cxx11::string::~string(local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
      std::__cxx11::string::~string(local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
      pGVar3 = local_2b0;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if (visibilityMask == (XrVisibilityMaskKHR *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_800,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",&local_801);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_828,"xrGetVisibilityMaskKHR",&local_829);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_848,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_868,
                     "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not optional and must be non-NULL"
                     ,&local_869);
          CoreValidLogMessage(pGVar3,(string *)local_800,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_828,&local_848,(string *)local_868);
          std::__cxx11::string::~string(local_868);
          std::allocator<char>::~allocator((allocator<char> *)&local_869);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_848);
          std::__cxx11::string::~string(local_828);
          std::allocator<char>::~allocator((allocator<char> *)&local_829);
          std::__cxx11::string::~string(local_800);
          std::allocator<char>::~allocator((allocator<char> *)&local_801);
          session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_890,"xrGetVisibilityMaskKHR",&local_891);
          objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ValidateXrStruct(pGVar3,(string *)local_890,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)local_50,false,true,visibilityMask);
          std::__cxx11::string::~string(local_890);
          std::allocator<char>::~allocator((allocator<char> *)&local_891);
          pGVar3 = local_2b0;
          if (objects_info.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
            session_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_8b8,"VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",&local_8b9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_8e0,"xrGetVisibilityMaskKHR",&local_8e1);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_900,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_920,"Command xrGetVisibilityMaskKHR param visibilityMask is invalid",
                       &local_921);
            CoreValidLogMessage(pGVar3,(string *)local_8b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                (string *)local_8e0,&local_900,(string *)local_920);
            std::__cxx11::string::~string(local_920);
            std::allocator<char>::~allocator((allocator<char> *)&local_921);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_900);
            std::__cxx11::string::~string(local_8e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
            std::__cxx11::string::~string(local_8b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
            session_local._4_4_ =
                 objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            info_with_instance.second._4_4_ = 1;
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_738);
        std::operator<<((ostream *)local_738,
                        "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ");
        Uint32ToHexString_abi_cxx11_((uint32_t)local_758);
        std::operator<<((ostream *)local_738,local_758);
        std::__cxx11::string::~string(local_758);
        pGVar3 = local_2b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_778,"VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter",&local_779);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7a0,"xrGetVisibilityMaskKHR",&local_7a1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_7c0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(pGVar3,(string *)local_778,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_7a0,&local_7c0,local_7e0);
        std::__cxx11::string::~string((string *)local_7e0);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_7c0);
        std::__cxx11::string::~string(local_7a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
        std::__cxx11::string::~string(local_778);
        std::allocator<char>::~allocator((allocator<char> *)&local_779);
        session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_738);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_4a0);
      std::operator<<((ostream *)local_4a0,
                      "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ");
      Uint32ToHexString_abi_cxx11_((uint32_t)local_4c0);
      std::operator<<((ostream *)local_4a0,local_4c0);
      std::__cxx11::string::~string(local_4c0);
      pGVar3 = local_2b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4e0,"VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",&local_4e1)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_508,"xrGetVisibilityMaskKHR",&local_509);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_528,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar3,(string *)local_4e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_508,&local_528,local_548);
      std::__cxx11::string::~string((string *)local_548);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_528);
      std::__cxx11::string::~string(local_508);
      std::allocator<char>::~allocator((allocator<char> *)&local_509);
      std::__cxx11::string::~string(local_4e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_4a0);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrGetVisibilityMaskKHR-session-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrGetVisibilityMaskKHR",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetVisibilityMaskKHR(
XrSession session,
XrViewConfigurationType viewConfigurationType,
uint32_t viewIndex,
XrVisibilityMaskTypeKHR visibilityMaskType,
XrVisibilityMaskKHR* visibilityMask) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrGetVisibilityMaskKHR-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrViewConfigurationType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "viewConfigurationType", objects_info, viewConfigurationType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(viewConfigurationType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-viewConfigurationType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Make sure the enum type XrVisibilityMaskTypeKHR value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrGetVisibilityMaskKHR", "xrGetVisibilityMaskKHR", "visibilityMaskType", objects_info, visibilityMaskType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrVisibilityMaskTypeKHR \"visibilityMaskType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(visibilityMaskType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMaskType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == visibilityMask) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR", objects_info,
                                "Invalid NULL for XrVisibilityMaskKHR \"visibilityMask\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrVisibilityMaskKHR is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetVisibilityMaskKHR", objects_info,
                                                        false, true, visibilityMask);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetVisibilityMaskKHR-visibilityMask-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetVisibilityMaskKHR",
                                objects_info,
                                "Command xrGetVisibilityMaskKHR param visibilityMask is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}